

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O2

void Am_Choice_Command_Repeat_Same_proc(Am_Object *command_obj)

{
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  local_18.type = 3;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  choice_general_undo_redo(&local_20,false,true,false,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_Command_Repeat_Same,
                 (Am_Object command_obj))
{
  choice_general_undo_redo(command_obj, false, true, false, (0L));
}